

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O2

void __thiscall Js::WebAssemblyTable::DirectSetValue(WebAssemblyTable *this,uint index,Var val)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->m_currentLength <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0xd9,"(index < m_currentLength)","index < m_currentLength");
    if (!bVar2) goto LAB_00c20051;
    *puVar3 = 0;
  }
  if (val != (Var)0x0) {
    bVar2 = VarIs<Js::WasmScriptFunction>(val);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                  ,0xda,"(!val || VarIs<WasmScriptFunction>(val))",
                                  "!val || VarIs<WasmScriptFunction>(val)");
      if (!bVar2) {
LAB_00c20051:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  Memory::WriteBarrierPtr<void>::WriteBarrierSet((this->m_values).ptr + index,val);
  return;
}

Assistant:

void
WebAssemblyTable::DirectSetValue(uint index, Var val)
{
    Assert(index < m_currentLength);
    Assert(!val || VarIs<WasmScriptFunction>(val));
    m_values[index] = val;
}